

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O2

void __thiscall SMC::init_REDCELL(SMC *this,Params *params)

{
  double *pdVar1;
  pointer piVar2;
  Residue *pRVar3;
  int iVar4;
  int j_1;
  int j;
  ulong uVar5;
  double dVar6;
  double local_60;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  vector<double,_std::allocator<double>_> EllipConst2A;
  
  EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar4 = 1;
  for (uVar5 = 0;
      piVar2 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar5 = uVar5 + 1) {
    local_60 = Ellipsoid_Detect(&this->Conf,piVar2[uVar5],
                                (params->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar5],true);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&EllipConst2A,&local_60);
  }
  piVar2 = (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_58 = &this->Reslist;
  do {
    local_60 = (double)CONCAT44(local_60._4_4_,iVar4);
    if ((this->Conf)._numRes < iVar4) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&EllipConst2A.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    iVar4 = Atom::is_at_origin(&(this->Conf)._res[iVar4]._center);
    if (iVar4 == 0) {
      uVar5 = 0;
      do {
        piVar2 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar5)
        goto LAB_00136965;
        pRVar3 = (this->Conf)._res;
        local_50 = Point::dis(&pRVar3[local_60._0_4_]._center.super_Point,
                              &pRVar3[piVar2[uVar5]]._atom[1].super_Point);
        pRVar3 = (this->Conf)._res;
        dVar6 = Point::dis(&pRVar3[local_60._0_4_]._center.super_Point,
                           &pRVar3[(params->ends).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar5]]._atom[2].
                            super_Point);
        pdVar1 = EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5;
        uVar5 = uVar5 + 1;
      } while (*pdVar1 + Residue::size[(this->Conf)._res[local_60._0_4_]._type] + 5.5 <=
               local_50 + dVar6);
      std::vector<int,_std::allocator<int>_>::push_back(local_58,(value_type_conflict *)&local_60);
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back(local_58,(value_type_conflict *)&local_60);
    }
LAB_00136965:
    iVar4 = local_60._0_4_ + 1;
  } while( true );
}

Assistant:

void SMC::init_REDCELL(const struct Params &params) {
    // calculate Ellipsoid constant 2a
    vector<double> EllipConst2A;
    for (int j = 0; j < params.starts.size(); j++)
        EllipConst2A.push_back(Ellipsoid_Detect(this->Conf, params.starts[j], params.ends[j], true));

    this->Reslist.clear();
    // test the space after using ellipsoid and surface
    for (int i = 1; i <= this->Conf._numRes; i++) {
        // Assuming this residue is part of simulated loop region, always include it!
        if (this->Conf._res[i]._center.is_at_origin()) {
            this->Reslist.push_back(i);
            continue;
        }

        for (int j = 0; j < params.starts.size(); j++) {
            const double dis = this->Conf._res[i]._center.dis(this->Conf._res[params.starts[j]]._atom[ATM_CA]) +
                               this->Conf._res[i]._center.dis(this->Conf._res[params.ends[j]]._atom[ATM_C]);
            if (dis < EllipConst2A[j] + Residue::size[this->Conf._res[i]._type] + CUB_SIZE) {
                this->Reslist.push_back(i);
                break;
            }
        }
    }
}